

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int DataManager::getLinkValue(int index,int param,double *value,Network *nw)

{
  int iVar1;
  Link *link_00;
  char *__to;
  double extraout_XMM0_Qa;
  double dVar2;
  double extraout_XMM0_Qa_00;
  double dVar3;
  Link *link;
  Network *nw_local;
  double *value_local;
  int param_local;
  int index_local;
  undefined4 extraout_var;
  
  *value = 0.0;
  if ((index < 0) || (iVar1 = Network::count(nw,LINK), iVar1 <= index)) {
    param_local = 0xcd;
  }
  else {
    iVar1 = Network::link(nw,(char *)(ulong)(uint)index,__to);
    link_00 = (Link *)CONCAT44(extraout_var,iVar1);
    switch(param) {
    case 0:
      dVar2 = link_00->diameter;
      dVar3 = Network::ucf(nw,DIAMETER);
      *value = dVar2 * dVar3;
      break;
    default:
      iVar1 = getPipeValue(param,link_00,value,nw);
      return iVar1;
    case 3:
      *value = link_00->lossCoeff;
      break;
    case 4:
      *value = (double)link_00->initStatus;
      break;
    case 5:
      *value = link_00->initSetting;
      break;
    case 8:
      dVar2 = link_00->flow;
      dVar3 = Network::ucf(nw,FLOW);
      *value = dVar2 * dVar3;
      break;
    case 9:
      (*(link_00->super_Element)._vptr_Element[0xd])();
      dVar2 = Network::ucf(nw,LENGTH);
      *value = extraout_XMM0_Qa * dVar2;
      break;
    case 10:
      dVar2 = link_00->hLoss;
      dVar3 = Network::ucf(nw,LENGTH);
      *value = dVar2 * dVar3;
      break;
    case 0xb:
      *value = (double)link_00->status;
      break;
    case 0xc:
      (*(link_00->super_Element)._vptr_Element[0x11])(link_00,nw);
      *value = extraout_XMM0_Qa_00;
      break;
    case 0xd:
      break;
    case 0xe:
      dVar2 = link_00->quality;
      dVar3 = Network::ucf(nw,CONCEN);
      *value = dVar2 * dVar3;
      break;
    case 0x11:
      dVar2 = link_00->leakage;
      dVar3 = Network::ucf(nw,FLOW);
      *value = dVar2 * dVar3;
    }
    param_local = 0;
  }
  return param_local;
}

Assistant:

int DataManager::getLinkValue(int index, int param, double* value, Network* nw)
{
    *value = 0.0;
    if ( index < 0 || index >= nw->count(Element::LINK) ) return 205;
    Link* link = nw->link(index);
    switch (param)
    {
    case EN_DIAMETER:
        *value = link->diameter * nw->ucf(Units::DIAMETER);
        break;
     case EN_MINORLOSS:
         *value = link->lossCoeff;
         break;
     case EN_INITSTATUS:
        *value = link->initStatus;
        break;
    case EN_INITSETTING:
        *value = link->initSetting;
        break;
    case EN_FLOW:
        *value = link->flow * nw->ucf(Units::FLOW);
        break;
    case EN_VELOCITY:
        *value = link->getVelocity() * nw->ucf(Units::LENGTH);
        break;
    case EN_HEADLOSS:
        *value = link->hLoss * nw->ucf(Units::LENGTH);
        break;
    case EN_STATUS:
        *value = link->status;
        break;
    case EN_SETTING:
        *value = link->getSetting(nw);
        break;
    case EN_ENERGY:
        break;                         // TO BE ADDED
    case EN_LINKQUAL:
        *value = link->quality * nw->ucf(Units::CONCEN);
        break;
    case EN_LEAKAGE:
        *value = link->leakage * nw->ucf(Units::FLOW);
        break;
    default: return getPipeValue(param, link, value, nw);
    }
    return 0;
}